

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

void mg_set_websocket_handler_with_subprotocols
               (mg_context *ctx,char *uri,mg_websocket_subprotocols *subprotocols,
               mg_websocket_connect_handler connect_handler,mg_websocket_ready_handler ready_handler
               ,mg_websocket_data_handler data_handler,mg_websocket_close_handler close_handler,
               void *cbdata)

{
  mg_set_handler_type(ctx,&ctx->dd,uri,1,
                      (uint)(((connect_handler == (mg_websocket_connect_handler)0x0 &&
                              ready_handler == (mg_websocket_ready_handler)0x0) &&
                             data_handler == (mg_websocket_data_handler)0x0) &&
                            close_handler == (mg_websocket_close_handler)0x0),
                      (mg_request_handler)0x0,subprotocols,connect_handler,ready_handler,
                      data_handler,close_handler,(mg_authorization_handler)0x0,cbdata);
  return;
}

Assistant:

CIVETWEB_API void
mg_set_websocket_handler_with_subprotocols(
    struct mg_context *ctx,
    const char *uri,
    struct mg_websocket_subprotocols *subprotocols,
    mg_websocket_connect_handler connect_handler,
    mg_websocket_ready_handler ready_handler,
    mg_websocket_data_handler data_handler,
    mg_websocket_close_handler close_handler,
    void *cbdata)
{
	int is_delete_request = (connect_handler == NULL) && (ready_handler == NULL)
	                        && (data_handler == NULL)
	                        && (close_handler == NULL);
	mg_set_handler_type(ctx,
	                    &(ctx->dd),
	                    uri,
	                    WEBSOCKET_HANDLER,
	                    is_delete_request,
	                    NULL,
	                    subprotocols,
	                    connect_handler,
	                    ready_handler,
	                    data_handler,
	                    close_handler,
	                    NULL,
	                    cbdata);
}